

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union.c
# Opt level: O2

LY_ERR lyplg_type_store_union
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *prefix_data,uint32_t hints,lysc_node *ctx_node,
                 lyd_value *storage,lys_glob_unres *unres,ly_err_item **err)

{
  uint *value_00;
  LY_ERR ret___1;
  LY_ERR LVar1;
  LY_ERR LVar2;
  lyd_value_union *subvalue;
  size_t sVar3;
  LY_ERR ret__;
  char *err_format;
  uint32_t options_local;
  ly_ctx *local_58;
  uint *local_50;
  uint32_t type_idx;
  size_t local_40;
  void *lyb_value;
  
  *err = (ly_err_item *)0x0;
  (storage->field_2).dec64 = 0;
  *(undefined8 *)((long)&storage->field_2 + 8) = 0;
  storage->_canonical = (char *)0x0;
  storage->realtype = (lysc_type *)0x0;
  *(undefined8 *)((long)&storage->field_2 + 0x10) = 0;
  options_local = options;
  local_58 = ctx;
  local_50 = (uint *)value;
  subvalue = (lyd_value_union *)calloc(1,0x50);
  (storage->field_2).subvalue = subvalue;
  if (subvalue == (lyd_value_union *)0x0) {
    LVar1 = LY_EMEM;
    goto LAB_001b0713;
  }
  storage->realtype = type;
  subvalue->hints = hints;
  subvalue->ctx_node = ctx_node;
  if (format == LY_VALUE_LYB) {
    lyb_value = (void *)0x0;
    local_40 = 0;
    if (value_len < 4) {
      err_format = "Invalid LYB union value size %zu (expected at least 4).";
      sVar3 = value_len;
LAB_001b0690:
      LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,err_format,sVar3);
      if (LVar1 == LY_SUCCESS) goto LAB_001b06d3;
    }
    else {
      sVar3 = (size_t)*local_50;
      if ((type[1].name == (char *)0x0) || (*(ulong *)(type[1].name + -8) <= sVar3)) {
        err_format = "Invalid LYB union type index %lu (type count %lu).";
        goto LAB_001b0690;
      }
LAB_001b06d3:
      value_00 = local_50;
      lyb_parse_union(local_50,value_len,&type_idx,&lyb_value,&local_40);
      LVar1 = union_subvalue_assignment
                        (value_00,value_len,&subvalue->original,&subvalue->orig_len,&options_local);
      if (LVar1 != LY_SUCCESS) {
        LVar1 = LY_EMEM;
        goto LAB_001b0713;
      }
      if (lyb_value == (void *)0x0) {
        subvalue->format = LY_VALUE_LYB;
      }
      else {
        LVar1 = lyplg_type_prefix_data_new
                          (local_58,lyb_value,local_40,LY_VALUE_LYB,prefix_data,&subvalue->format,
                           &subvalue->prefix_data);
        if (LVar1 != LY_SUCCESS) goto LAB_001b06b0;
        if (subvalue->format != LY_VALUE_LYB) {
          __assert_fail("subvalue->format == LY_VALUE_LYB",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/union.c"
                        ,0x171,
                        "LY_ERR lyb_fill_subvalue(const struct ly_ctx *, struct lysc_type_union *, const void *, size_t, void *, struct lyd_value_union *, uint32_t *, struct lys_glob_unres *, struct ly_err_item **)"
                       );
        }
      }
      LVar1 = union_store_type(local_58,(lysc_type_union *)type,type_idx,subvalue,options_local,'\0'
                               ,(lyd_node *)0x0,(lyd_node *)0x0,unres,err);
    }
LAB_001b06b0:
    if ((LVar1 != LY_SUCCESS) && (LVar1 != LY_EINCOMPLETE)) goto LAB_001b0713;
  }
  else {
    options_local = options & 0xfffffff7;
    LVar2 = union_subvalue_assignment
                      (local_50,value_len,&subvalue->original,&subvalue->orig_len,&options_local);
    LVar1 = LY_EMEM;
    if (((LVar2 != LY_SUCCESS) ||
        (LVar1 = lyplg_type_prefix_data_new
                           (local_58,local_50,value_len,format,prefix_data,&subvalue->format,
                            &subvalue->prefix_data), LVar1 != LY_SUCCESS)) ||
       ((LVar1 = union_find_type(local_58,(lysc_type_union *)type,subvalue,options_local,'\0',
                                 (lyd_node *)0x0,(lyd_node *)0x0,(uint32_t *)0x0,unres,err),
        LVar1 != LY_EINCOMPLETE && (LVar1 != LY_SUCCESS)))) goto LAB_001b0713;
  }
  LVar2 = lydict_insert(local_58,(subvalue->value)._canonical,0,&storage->_canonical);
  if (LVar2 != LY_SUCCESS) {
    LVar1 = LVar2;
  }
LAB_001b0713:
  if ((options_local & 1) != 0) {
    free(local_50);
  }
  if ((LVar1 != LY_SUCCESS) && (LVar1 != LY_EINCOMPLETE)) {
    lyplg_type_free_union(local_58,storage);
  }
  return LVar1;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_store_union(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value, size_t value_len,
        uint32_t options, LY_VALUE_FORMAT format, void *prefix_data, uint32_t hints, const struct lysc_node *ctx_node,
        struct lyd_value *storage, struct lys_glob_unres *unres, struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS, r;
    struct lysc_type_union *type_u = (struct lysc_type_union *)type;
    struct lyd_value_union *subvalue;

    *err = NULL;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    LYPLG_TYPE_VAL_INLINE_PREPARE(storage, subvalue);
    LY_CHECK_ERR_GOTO(!subvalue, ret = LY_EMEM, cleanup);
    storage->realtype = type;
    subvalue->hints = hints;
    subvalue->ctx_node = ctx_node;

    if (format == LY_VALUE_LYB) {
        ret = lyb_fill_subvalue(ctx, type_u, value, value_len, prefix_data, subvalue, &options, unres, err);
        LY_CHECK_GOTO((ret != LY_SUCCESS) && (ret != LY_EINCOMPLETE), cleanup);
    } else {
        /* to correctly resolve the union type, we need to always validate the value */
        options &= ~LYPLG_TYPE_STORE_ONLY;

        /* store value to subvalue */
        ret = union_subvalue_assignment(value, value_len, &subvalue->original, &subvalue->orig_len, &options);
        LY_CHECK_GOTO(ret, cleanup);

        /* store format-specific data for later prefix resolution */
        ret = lyplg_type_prefix_data_new(ctx, value, value_len, format, prefix_data, &subvalue->format,
                &subvalue->prefix_data);
        LY_CHECK_GOTO(ret, cleanup);

        /* use the first usable subtype to store the value */
        ret = union_find_type(ctx, type_u, subvalue, options, 0, NULL, NULL, NULL, unres, err);
        LY_CHECK_GOTO((ret != LY_SUCCESS) && (ret != LY_EINCOMPLETE), cleanup);
    }

    /* store canonical value, if any (use the specific type value) */
    r = lydict_insert(ctx, subvalue->value._canonical, 0, &storage->_canonical);
    LY_CHECK_ERR_GOTO(r, ret = r, cleanup);

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if ((ret != LY_SUCCESS) && (ret != LY_EINCOMPLETE)) {
        lyplg_type_free_union(ctx, storage);
    }
    return ret;
}